

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxtick.cpp
# Opt level: O3

void processFile(MidiFile *midifile,Options *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"maxtick=",8);
  iVar3 = smf::MidiFile::getFileDurationInTicks(midifile);
  std::ostream::operator<<((ostream *)&std::cout,iVar3);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"quarters","");
  bVar2 = smf::Options::getBoolean(options,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tquarters=",10);
    dVar4 = smf::MidiFile::getFileDurationInQuarters(midifile);
    std::ostream::_M_insert<double>(dVar4);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"seconds","");
  bVar2 = smf::Options::getBoolean(options,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tseconds=",9);
    dVar4 = smf::MidiFile::getFileDurationInSeconds(midifile);
    std::ostream::_M_insert<double>(dVar4);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  return;
}

Assistant:

void processFile(MidiFile& midifile, Options& options) {
	cout << "maxtick=" << midifile.getFileDurationInTicks();
	if (options.getBoolean("quarters")) {
		cout << "\tquarters=" << midifile.getFileDurationInQuarters();
	}
	if (options.getBoolean("seconds")) {
		cout << "\tseconds=" << midifile.getFileDurationInSeconds();
	}
	cout << endl;
}